

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *scale,
          Pixel *tint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Sprite *pSVar5;
  long lVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  DecalInstance di;
  float local_8c;
  value_type local_88;
  double local_18;
  
  local_88.uv[0].x = 0.0;
  local_88.uv[0].y = 0.0;
  local_88.uv[1].x = 0.0;
  local_88.uv[1].y = 1.0;
  local_88.uv[2].x = 1.0;
  local_88.uv[2].y = 1.0;
  local_88.uv[3].x = 1.0;
  local_88.uv[3].y = 0.0;
  local_88.w[0] = 1.0;
  local_88.w[1] = 1.0;
  local_88.w[2] = 1.0;
  local_88.w[3] = 1.0;
  local_88.tint[1].field_0 = WHITE;
  local_88.tint[2].field_0 = WHITE;
  local_88.tint[3].field_0 = WHITE;
  local_88.tint[0].field_0.field_1 = tint->field_0;
  fVar1 = center->x;
  fVar2 = center->y;
  fVar3 = scale->x;
  fVar4 = scale->y;
  local_88.pos[0].x = (0.0 - fVar1) * fVar3;
  local_88.pos[0].y = (0.0 - fVar2) * fVar4;
  pSVar5 = decal->sprite;
  local_88.pos[1].y = ((float)pSVar5->height - fVar2) * fVar4;
  local_88.pos[1].x = local_88.pos[0].x;
  local_88.pos[2].y = ((float)pSVar5->height - fVar2) * fVar4;
  local_88.pos[2].x = ((float)pSVar5->width - fVar1) * fVar3;
  local_88.pos[3].y = local_88.pos[0].y;
  local_88.pos[3].x = ((float)pSVar5->width - fVar1) * fVar3;
  local_18 = (double)fAngle;
  local_88.decal = decal;
  dVar7 = cos(local_18);
  local_8c = (float)dVar7;
  dVar7 = sin(local_18);
  fVar1 = pos->x;
  fVar2 = pos->y;
  fVar3 = (this->vInvScreenSize).x;
  fVar4 = (this->vInvScreenSize).y;
  lVar6 = 0xc;
  do {
    fVar8 = *(float *)((long)&((value_type *)(local_88.pos + -1))->decal + lVar6);
    fVar9 = ((*(float *)((long)&local_8c + lVar6) * local_8c - (float)dVar7 * fVar8) + fVar1) *
            fVar3;
    fVar8 = (*(float *)((long)&local_8c + lVar6) * (float)dVar7 + fVar8 * local_8c + fVar2) * fVar4;
    *(float *)((long)&local_8c + lVar6) = fVar9 + fVar9 + -1.0;
    *(float *)((long)&((value_type *)(local_88.pos + -1))->decal + lVar6) = -(fVar8 + fVar8 + -1.0);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x2c);
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             &local_88);
  return;
}

Assistant:

v2d_generic(T _x, T _y) : x(_x), y(_y) {}